

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool __thiscall Matrix::IsDiagonal(Matrix *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool local_41;
  Fraction local_38;
  
  local_41 = this->n_ < 1;
  if (0 < this->n_) {
    lVar4 = 0;
    do {
      bVar2 = 0 < this->m_;
      if (0 < this->m_) {
        lVar5 = 0;
        lVar6 = 0;
        do {
          if (lVar4 != lVar6) {
            lVar1 = *(long *)&(this->elements_).
                              super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar4].
                              super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                              super__Vector_impl_data;
            Fraction::Fraction(&local_38,0);
            bVar3 = operator!=((Fraction *)(lVar1 + lVar5),&local_38);
            if (bVar3) {
              if (bVar2) {
                return local_41;
              }
              break;
            }
          }
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 8;
          bVar2 = lVar6 < this->m_;
        } while (lVar6 < this->m_);
      }
      lVar4 = lVar4 + 1;
      local_41 = this->n_ <= lVar4;
    } while (lVar4 < this->n_);
  }
  return local_41;
}

Assistant:

bool Matrix::IsDiagonal() const {
  for (int row = 0; row < n_; ++row) {
    for (int column = 0; column < m_; ++column) {
      if (row != column && elements_[row][column] != 0) {
        return false;
      }
    }
  }

  return true;
}